

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::OpenPopupEx(ImGuiID id,ImGuiPopupFlags popup_flags)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ImGuiWindow *pIVar5;
  ImVec2 IVar6;
  ImGuiPopupData *pIVar7;
  ImGuiContext *pIVar8;
  ImVec2 *pIVar9;
  ImGuiPopupData *__dest;
  int iVar10;
  int iVar11;
  int iVar12;
  size_t sVar13;
  ImGuiContext *g;
  ImVec2 local_38;
  
  pIVar8 = GImGui;
  iVar2 = (GImGui->BeginPopupStack).Size;
  if (((popup_flags & 0x20U) != 0) && (iVar2 < (GImGui->OpenPopupStack).Size)) {
    return;
  }
  local_38.x = 0.0;
  local_38.y = 0.0;
  pIVar5 = GImGui->NavWindow;
  iVar3 = GImGui->FrameCount;
  uVar4 = (GImGui->CurrentWindow->IDStack).Data[(long)(GImGui->CurrentWindow->IDStack).Size + -1];
  local_38 = NavCalcPreferredRefPos();
  pIVar9 = &(pIVar8->IO).MousePos;
  if ((pIVar8->IO).MousePos.y < -256000.0 || (pIVar8->IO).MousePos.x < -256000.0) {
    pIVar9 = &local_38;
  }
  IVar6 = *pIVar9;
  iVar11 = (pIVar8->OpenPopupStack).Size;
  if (iVar2 < iVar11) {
    pIVar7 = (pIVar8->OpenPopupStack).Data;
    if ((pIVar7[iVar2].PopupId == id) && (pIVar7[iVar2].OpenFrameCount == iVar3 + -1)) {
      pIVar7[iVar2].OpenFrameCount = iVar3;
      return;
    }
    ClosePopupToLevel(iVar2,false);
    iVar12 = (pIVar8->OpenPopupStack).Size;
    iVar2 = (pIVar8->OpenPopupStack).Capacity;
    if (iVar12 != iVar2) goto LAB_0012c3fa;
    iVar12 = iVar12 + 1;
    if (iVar2 == 0) {
      iVar11 = 8;
    }
    else {
      iVar11 = iVar2 / 2 + iVar2;
    }
    if (iVar12 < iVar11) {
      iVar12 = iVar11;
    }
    if (iVar12 <= iVar2) goto LAB_0012c3fa;
    sVar13 = (long)iVar12 * 0x30;
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
  }
  else {
    iVar2 = (pIVar8->OpenPopupStack).Capacity;
    if (iVar11 != iVar2) goto LAB_0012c3fa;
    if (iVar2 == 0) {
      iVar10 = 8;
    }
    else {
      iVar10 = iVar2 / 2 + iVar2;
    }
    iVar12 = iVar11 + 1;
    if (iVar11 + 1 < iVar10) {
      iVar12 = iVar10;
    }
    if (iVar12 <= iVar2) goto LAB_0012c3fa;
    sVar13 = (long)iVar12 * 0x30;
    if (pIVar8 != (ImGuiContext *)0x0) {
      piVar1 = &(pIVar8->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
  }
  __dest = (ImGuiPopupData *)(*GImAllocatorAllocFunc)(sVar13,GImAllocatorUserData);
  pIVar7 = (pIVar8->OpenPopupStack).Data;
  if (pIVar7 != (ImGuiPopupData *)0x0) {
    memcpy(__dest,pIVar7,(long)(pIVar8->OpenPopupStack).Size * 0x30);
    pIVar7 = (pIVar8->OpenPopupStack).Data;
    if ((pIVar7 != (ImGuiPopupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(pIVar7,GImAllocatorUserData);
  }
  (pIVar8->OpenPopupStack).Data = __dest;
  (pIVar8->OpenPopupStack).Capacity = iVar12;
LAB_0012c3fa:
  pIVar7 = (pIVar8->OpenPopupStack).Data;
  iVar2 = (pIVar8->OpenPopupStack).Size;
  pIVar7[iVar2].PopupId = id;
  *(undefined4 *)&pIVar7[iVar2].field_0x4 = 0;
  pIVar7[iVar2].Window = (ImGuiWindow *)0x0;
  pIVar7[iVar2].SourceWindow = pIVar5;
  pIVar7[iVar2].OpenFrameCount = iVar3;
  pIVar7[iVar2].OpenParentId = uVar4;
  pIVar7[iVar2].OpenPopupPos = local_38;
  pIVar7[iVar2].OpenMousePos = IVar6;
  (pIVar8->OpenPopupStack).Size = (pIVar8->OpenPopupStack).Size + 1;
  return;
}

Assistant:

void ImGui::OpenPopupEx(ImGuiID id, ImGuiPopupFlags popup_flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* parent_window = g.CurrentWindow;
    const int current_stack_size = g.BeginPopupStack.Size;

    if (popup_flags & ImGuiPopupFlags_NoOpenOverExistingPopup)
        if (IsPopupOpen(0u, ImGuiPopupFlags_AnyPopupId))
            return;

    ImGuiPopupData popup_ref; // Tagged as new ref as Window will be set back to NULL if we write this into OpenPopupStack.
    popup_ref.PopupId = id;
    popup_ref.Window = NULL;
    popup_ref.SourceWindow = g.NavWindow;
    popup_ref.OpenFrameCount = g.FrameCount;
    popup_ref.OpenParentId = parent_window->IDStack.back();
    popup_ref.OpenPopupPos = NavCalcPreferredRefPos();
    popup_ref.OpenMousePos = IsMousePosValid(&g.IO.MousePos) ? g.IO.MousePos : popup_ref.OpenPopupPos;

    IMGUI_DEBUG_LOG_POPUP("OpenPopupEx(0x%08X)\n", id);
    if (g.OpenPopupStack.Size < current_stack_size + 1)
    {
        g.OpenPopupStack.push_back(popup_ref);
    }
    else
    {
        // Gently handle the user mistakenly calling OpenPopup() every frame. It is a programming mistake! However, if we were to run the regular code path, the ui
        // would become completely unusable because the popup will always be in hidden-while-calculating-size state _while_ claiming focus. Which would be a very confusing
        // situation for the programmer. Instead, we silently allow the popup to proceed, it will keep reappearing and the programming error will be more obvious to understand.
        if (g.OpenPopupStack[current_stack_size].PopupId == id && g.OpenPopupStack[current_stack_size].OpenFrameCount == g.FrameCount - 1)
        {
            g.OpenPopupStack[current_stack_size].OpenFrameCount = popup_ref.OpenFrameCount;
        }
        else
        {
            // Close child popups if any, then flag popup for open/reopen
            ClosePopupToLevel(current_stack_size, false);
            g.OpenPopupStack.push_back(popup_ref);
        }

        // When reopening a popup we first refocus its parent, otherwise if its parent is itself a popup it would get closed by ClosePopupsOverWindow().
        // This is equivalent to what ClosePopupToLevel() does.
        //if (g.OpenPopupStack[current_stack_size].PopupId == id)
        //    FocusWindow(parent_window);
    }
}